

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
          (TextureRenderer *this,int texUnit,float *texCoord,TextureType texType)

{
  RenderParams local_68;
  TextureType local_24;
  float *pfStack_20;
  TextureType texType_local;
  float *texCoord_local;
  TextureRenderer *pTStack_10;
  int texUnit_local;
  TextureRenderer *this_local;
  
  local_24 = texType;
  pfStack_20 = texCoord;
  texCoord_local._4_4_ = texUnit;
  pTStack_10 = this;
  glu::TextureTestUtil::RenderParams::RenderParams(&local_68,texType);
  renderQuad(this,texUnit,texCoord,&local_68);
  return;
}

Assistant:

void TextureRenderer::renderQuad (int texUnit, const float* texCoord, TextureType texType)
{
	renderQuad(texUnit, texCoord, RenderParams(texType));
}